

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_data.cpp
# Opt level: O0

void Cmd_gl_resetmap(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  int key_local;
  APlayerPawn *who_local;
  FCommandLine *argv_local;
  
  bVar1 = IsLightmodeValid();
  if (bVar1) {
    glset.lightmode = glset.map_lightmode;
  }
  else {
    iVar2 = FIntCVar::operator_cast_to_int(&gl_lightmode);
    glset.lightmode = (SBYTE)iVar2;
  }
  if (glset.map_nocoloredspritelighting == -1) {
    glset.nocoloredspritelighting = FBoolCVar::operator_cast_to_bool(&gl_nocoloredspritelighting);
  }
  else {
    glset.nocoloredspritelighting = glset.map_nocoloredspritelighting != '\0';
  }
  if (glset.map_notexturefill == -1) {
    glset.notexturefill = FBoolCVar::operator_cast_to_bool(&gl_notexturefill);
  }
  else {
    glset.notexturefill = glset.map_notexturefill != '\0';
  }
  if (glset.map_brightfog == -1) {
    glset.brightfog = FBoolCVar::operator_cast_to_bool(&gl_brightfog);
  }
  else {
    glset.brightfog = glset.map_brightfog != '\0';
  }
  return;
}

Assistant:

CCMD(gl_resetmap)
{
	if (!IsLightmodeValid()) glset.lightmode = gl_lightmode;
	else glset.lightmode = glset.map_lightmode;
	if (glset.map_nocoloredspritelighting == -1) glset.nocoloredspritelighting = gl_nocoloredspritelighting;
	else glset.nocoloredspritelighting = !!glset.map_nocoloredspritelighting;
	if (glset.map_notexturefill == -1) glset.notexturefill = gl_notexturefill;
	else glset.notexturefill = !!glset.map_notexturefill;
	if (glset.map_brightfog == -1) glset.brightfog = gl_brightfog;
	else glset.brightfog = !!glset.map_brightfog;
}